

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::PtexUtils::divalpha(void *data,int npixels,DataType dt,int nchannels,int alphachan)

{
  void *pvVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  ushort uVar5;
  uint16_t uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  ulong uVar11;
  int i_1;
  ulong uVar12;
  
  if (dt < 4) {
    fVar2 = *(float *)(OneValue(Ptex::v2_2::DataType)::one + (ulong)dt * 4);
    switch((ulong)dt) {
    case 0:
      uVar7 = nchannels - 1;
      if (alphachan != 0) {
        uVar7 = alphachan;
      }
      lVar9 = (long)data + (ulong)(alphachan == 0);
      lVar8 = npixels * nchannels + lVar9;
      uVar12 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar12 = 0;
      }
      for (; lVar9 != lVar8; lVar9 = lVar9 + nchannels) {
        bVar4 = *(byte *)(lVar9 + (int)(-(uint)(alphachan == 0) | alphachan));
        if (bVar4 != 0) {
          for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
            *(char *)(lVar9 + uVar11) =
                 (char)(int)((float)*(byte *)(lVar9 + uVar11) * (fVar2 / (float)bVar4));
          }
        }
      }
      break;
    case 1:
      uVar7 = nchannels - 1;
      if (alphachan != 0) {
        uVar7 = alphachan;
      }
      pvVar10 = (void *)((long)data + (ulong)(alphachan == 0) * 2);
      pvVar1 = (void *)((long)pvVar10 + (long)(npixels * nchannels) * 2);
      uVar12 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar12 = 0;
      }
      for (; pvVar10 != pvVar1; pvVar10 = (void *)((long)pvVar10 + (long)nchannels * 2)) {
        uVar5 = *(ushort *)((long)pvVar10 + (long)(int)(-(uint)(alphachan == 0) | alphachan) * 2);
        if (uVar5 != 0) {
          for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
            *(short *)((long)pvVar10 + uVar11 * 2) =
                 (short)(int)((float)*(ushort *)((long)pvVar10 + uVar11 * 2) *
                             (fVar2 / (float)uVar5));
          }
        }
      }
      break;
    case 2:
      uVar7 = nchannels - 1;
      if (alphachan != 0) {
        uVar7 = alphachan;
      }
      pvVar10 = (void *)((long)data + (ulong)(alphachan == 0) * 2);
      pvVar1 = (void *)((long)pvVar10 + (long)(npixels * nchannels) * 2);
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      for (; pvVar10 != pvVar1; pvVar10 = (void *)((long)pvVar10 + (long)nchannels * 2)) {
        fVar3 = *(float *)(PtexHalf::h2fTable +
                          (ulong)*(ushort *)
                                  ((long)pvVar10 +
                                  (long)(int)(-(uint)(alphachan == 0) | alphachan) * 2) * 4);
        if ((fVar3 != 0.0) || (NAN(fVar3))) {
          for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
            uVar6 = PtexHalf::fromFloat(*(float *)(PtexHalf::h2fTable +
                                                  (ulong)*(ushort *)((long)pvVar10 + uVar12 * 2) * 4
                                                  ) * (fVar2 / fVar3));
            *(uint16_t *)((long)pvVar10 + uVar12 * 2) = uVar6;
          }
        }
      }
      break;
    case 3:
      uVar7 = nchannels - 1;
      if (alphachan != 0) {
        uVar7 = alphachan;
      }
      pvVar10 = (void *)((long)data + (ulong)(alphachan == 0) * 4);
      pvVar1 = (void *)((long)pvVar10 + (long)(npixels * nchannels) * 4);
      uVar12 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar12 = 0;
      }
      for (; pvVar10 != pvVar1; pvVar10 = (void *)((long)pvVar10 + (long)nchannels * 4)) {
        fVar3 = *(float *)((long)pvVar10 + (long)(int)(-(uint)(alphachan == 0) | alphachan) * 4);
        if ((fVar3 != 0.0) || (NAN(fVar3))) {
          for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
            *(float *)((long)pvVar10 + uVar11 * 4) =
                 *(float *)((long)pvVar10 + uVar11 * 4) * (fVar2 / fVar3);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void divalpha(void* data, int npixels, DataType dt, int nchannels, int alphachan)
{
    float scale = OneValue(dt);
    switch(dt) {
    case dt_uint8:    divalpha(static_cast<uint8_t*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_uint16:   divalpha(static_cast<uint16_t*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_half:     divalpha(static_cast<PtexHalf*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_float:    divalpha(static_cast<float*>(data), npixels, nchannels, alphachan, scale); break;
    }
}